

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  byte bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  SectionEndInfo endInfo;
  SectionEndInfo local_a0;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00166ed8;
  if (this->m_sectionIncluded == true) {
    gettimeofday((timeval *)&local_a0,(__timezone_ptr_t)0x0);
    SectionEndInfo::SectionEndInfo
              (&local_a0,&this->m_info,&this->m_assertions,
               (double)(uint)(((int)local_a0.sectionInfo.runContext * 1000000 +
                              (int)local_a0.sectionInfo.name._M_dataplus._M_p) -
                             (int)(this->m_timer).m_ticks) / 1000000.0);
    bVar2 = std::uncaught_exception();
    (*this->m_runContext->_vptr_IRunContext[(ulong)bVar2 + 4])(this->m_runContext,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.sectionInfo.lineInfo.file._M_dataplus._M_p !=
        &local_a0.sectionInfo.lineInfo.file.field_2) {
      operator_delete(local_a0.sectionInfo.lineInfo.file._M_dataplus._M_p,
                      local_a0.sectionInfo.lineInfo.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.sectionInfo.description._M_dataplus._M_p !=
        &local_a0.sectionInfo.description.field_2) {
      operator_delete(local_a0.sectionInfo.description._M_dataplus._M_p,
                      local_a0.sectionInfo.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a0.sectionInfo.name._M_dataplus._M_p._4_4_,
                    (int)local_a0.sectionInfo.name._M_dataplus._M_p) !=
        &local_a0.sectionInfo.name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a0.sectionInfo.name._M_dataplus._M_p._4_4_,
                               (int)local_a0.sectionInfo.name._M_dataplus._M_p),
                      local_a0.sectionInfo.name.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar3 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  paVar3 = &(this->m_info).lineInfo.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_info).description._M_dataplus._M_p;
  paVar3 = &(this->m_info).description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_info).name._M_dataplus._M_p;
  paVar3 = &(this->m_info).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo( m_info, m_assertions, m_timer.getElapsedSeconds() );
            if( std::uncaught_exception() )
                m_runContext.sectionEndedEarly( endInfo );
            else
                m_runContext.sectionEnded( endInfo );
        }
    }